

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::ReturnStmt::set_parent(ReturnStmt *this,IRNode *parent)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint32_t width;
  FunctionStmtBlock *this_00;
  shared_ptr<kratos::AssignStmt> sVar3;
  undefined1 local_30 [8];
  shared_ptr<kratos::AssignStmt> s;
  
  (this->super_Stmt).parent_ = parent;
  this_00 = this->func_def_;
  this_00->has_return_value_ = true;
  peVar1 = (this_00->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this_00->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    this_00 = this->func_def_;
  }
  if (peVar1 == (element_type *)0x0) {
    width = (*(((this->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    FunctionStmtBlock::create_function_handler
              (this_00,width,
               ((this->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               is_signed_);
    this_00 = this->func_def_;
  }
  peVar1 = (this_00->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this_00->function_handler_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  sVar3 = Var::assign((Var *)local_30,(shared_ptr<kratos::Var> *)peVar1,(int)this + 200);
  (**(code **)(*(_func_int **)local_30 + 0x38))
            (local_30,this,
             sVar3.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  if (s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  return;
}

Assistant:

void ReturnStmt::set_parent(kratos::IRNode *parent) {
    Stmt::set_parent(parent);
    // looping to make sure there is a function statement block
    // it will never be 10k deep. this is to avoid infinite loop when construction failed
    /* comment this out because can only be determined after every statements has been set
     * TODO:
     * add a pass to analysis returns
    }
     */
    func_def_->set_has_return_value(true);
    // need to handle the assignments
    if (!func_def_->function_handler()) {
        // create a function handler
        func_def_->create_function_handler(value_->width(), value_->is_signed());
    }
    auto p = func_def_->function_handler();
    auto s = p->assign(value_, AssignmentType::Blocking);
    s->set_parent(this);
}